

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O1

void construct_children<std::pair<int,float>>
               (directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *current_cell,
               directed_graph_t *graph,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *possible_next_vertices,
               int max_dimension,int current_dimension)

{
  ushort vertex;
  ushort *puVar1;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *current_cell_00;
  ushort *puVar2;
  ushort *puVar3;
  unsigned_short v;
  vector<unsigned_short,_std::allocator<unsigned_short>_> new_possible_vertices;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2;
  ushort local_62;
  int local_60;
  int local_5c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_58;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_40;
  ushort *local_38;
  
  if (current_dimension != max_dimension) {
    puVar2 = (possible_next_vertices->
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (possible_next_vertices->
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar2 != puVar3) {
      local_60 = current_dimension + 1;
      local_5c = max_dimension;
      local_40 = possible_next_vertices;
      local_38 = puVar3;
      do {
        vertex = *puVar2;
        if (vertex != current_cell->vertex) {
          local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
          local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (unsigned_short *)0x0;
          puVar1 = (local_40->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (puVar3 = (local_40->
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                        .super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
            local_62 = *puVar3;
            if (((local_62 != vertex) && (local_62 != current_cell->vertex)) &&
               (((graph->incidence_outgoing).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [graph->incidence_row_length * (ulong)vertex + (ulong)(local_62 >> 6)] >>
                 ((ulong)local_62 & 0x3f) & 1) != 0)) {
              if (local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_short,std::allocator<unsigned_short>>::
                _M_realloc_insert<unsigned_short_const&>
                          ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_58,
                           (iterator)
                           local_58.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_62);
              }
              else {
                *local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish = local_62;
                local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_finish =
                     local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
          }
          current_cell_00 =
               directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::add_child
                         (current_cell,vertex);
          construct_children<std::pair<int,float>>
                    (current_cell_00,graph,&local_58,local_5c,local_60);
          puVar3 = local_38;
          if (local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_58.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        puVar2 = puVar2 + 1;
      } while (puVar2 != puVar3);
    }
  }
  return;
}

Assistant:

void construct_children(directed_flag_complex_cell_in_memory_t<ExtraData>& current_cell, const directed_graph_t& graph,
                        const std::vector<vertex_index_t>& possible_next_vertices, int max_dimension,
                        int current_dimension = 0) {
	if (current_dimension == max_dimension) return;

	for (auto vertex : possible_next_vertices) {
		if (vertex == current_cell.vertex) continue;

		// Compute the next elements
		std::vector<vertex_index_t> new_possible_vertices;
		for (auto v : possible_next_vertices)
			if (v != vertex && v != current_cell.vertex && graph.is_connected_by_an_edge(vertex, v))
				new_possible_vertices.push_back(v);

		directed_flag_complex_cell_in_memory_t<ExtraData>& new_cell = current_cell.add_child(vertex);
		construct_children(new_cell, graph, new_possible_vertices, max_dimension, current_dimension + 1);
	}
}